

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObject_private.hh
# Opt level: O2

void __thiscall
QPDF_Stream::QPDF_Stream(QPDF_Stream *this,QPDFObjectHandle *stream_dict,size_t length)

{
  bool bVar1;
  logic_error *this_00;
  size_t length_local;
  
  std::make_unique<QPDF_Stream::Members,QPDFObjectHandle&,unsigned_long&>
            ((QPDFObjectHandle *)this,(unsigned_long *)stream_dict);
  bVar1 = QPDFObjectHandle::isDictionary(stream_dict);
  if (bVar1) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,"stream object instantiated with non-dictionary object for dictionary");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

QPDF_Stream(QPDFObjectHandle stream_dict, size_t length) :
        m(std::make_unique<Members>(stream_dict, length))
    {
        if (!stream_dict.isDictionary()) {
            throw std::logic_error(
                "stream object instantiated with non-dictionary object for dictionary");
        }
    }